

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::eval_pow(any *__return_storage_ptr__,Int dim,any *lhs,any *rhs)

{
  any *rhs_local;
  any *lhs_local;
  Int dim_local;
  
  if (dim == 3) {
    eval_pow<3>(__return_storage_ptr__,lhs,rhs);
  }
  else if (dim == 2) {
    eval_pow<2>(__return_storage_ptr__,lhs,rhs);
  }
  else {
    eval_pow<1>(__return_storage_ptr__,lhs,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

any eval_pow(Int dim, any& lhs, any& rhs) {
  if (dim == 3) return eval_pow<3>(lhs, rhs);
  if (dim == 2) return eval_pow<2>(lhs, rhs);
  return eval_pow<1>(lhs, rhs);
}